

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::CoroutineBase::tracePromise(CoroutineBase *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  PromiseNode *pPVar2;
  void **ppvVar3;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,stopAtNextEvent) == 0) {
    pOVar1 = (this->promiseNodeForTrace).ptr;
    if (pOVar1 != (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
      pPVar2 = pOVar1->ptr;
      (*(pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar2,builder,0);
    }
    ppvVar3 = builder->current;
    if (ppvVar3 < builder->limit) {
      builder->current = ppvVar3 + 1;
      *ppvVar3 = std::__n4861::coroutine_handle<void>::operator();
    }
  }
  return;
}

Assistant:

void CoroutineBase::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  if (stopAtNextEvent) return;

  KJ_IF_SOME(promise, promiseNodeForTrace) {
    promise->tracePromise(builder, stopAtNextEvent);
  }

  // Maybe returning the address of coroutine() will give us a function name with meaningful type
  // information. (Narrator: It doesn't.)
  builder.add(GetFunctorStartAddress<>::apply(coroutine));
}